

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O2

fe_t * fe_init_auto_r(cmd_ln_t *config)

{
  short sVar1;
  int iVar2;
  fe_t *fe;
  cmd_ln_t *config_00;
  int16 *piVar3;
  window_t *in;
  melfb_t *mel;
  ulong uVar4;
  noise_stats_t *pnVar5;
  vad_data_t *pvVar6;
  prespch_buf_t *ppVar7;
  frame_t *pfVar8;
  powspec_t *ppVar9;
  char *pcVar10;
  long lVar11;
  uint num_cepstra;
  double dVar12;
  
  fe = (fe_t *)__ckd_calloc__(1,0xa8,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_interface.c"
                              ,0xd9);
  fe->refcount = 1;
  config_00 = cmd_ln_retain(config);
  iVar2 = fe_parse_general_params(config_00,fe);
  if (-1 < iVar2) {
    fe->frame_shift = (int16)(int)((float)fe->sampling_rate / (float)(int)fe->frame_rate + 0.5);
    fe->frame_size = (int16)(int)((float)fe->sampling_rate * (float)fe->window_length + 0.5);
    fe->pre_emphasis_prior = 0;
    fe_start_stream(fe);
    if (fe->frame_shift < 2) {
      __assert_fail("fe->frame_shift > 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_interface.c"
                    ,0xec,"fe_t *fe_init_auto_r(cmd_ln_t *)");
    }
    sVar1 = fe->frame_size;
    if (sVar1 < fe->frame_shift) {
      pcVar10 = "Frame size %d (-wlen) must be greater than frame shift %d (-frate)\n";
      lVar11 = 0xf1;
    }
    else {
      if (sVar1 <= fe->fft_size) {
        if (fe->dither != '\0') {
          fe_init_dither(fe->dither_seed);
          sVar1 = fe->frame_size;
        }
        piVar3 = (int16 *)__ckd_calloc__((long)sVar1,2,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_interface.c"
                                         ,0x103);
        fe->overflow_samps = piVar3;
        in = (window_t *)
             __ckd_calloc__((long)(fe->frame_size / 2),8,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_interface.c"
                            ,0x104);
        fe->hamming_window = in;
        fe_create_hamming(in,(int)fe->frame_size);
        mel = (melfb_t *)
              __ckd_calloc__(1,0x78,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_interface.c"
                             ,0x10a);
        fe->mel_fb = mel;
        mel->sampling_rate = fe->sampling_rate;
        mel->fft_size = (int)fe->fft_size;
        mel->num_cepstra = (uint)fe->num_cepstra;
        uVar4 = cmd_ln_int_r(config,"-nfilt");
        mel->num_filters = (int32)uVar4;
        if (fe->log_spec == '\0') {
          uVar4 = (ulong)fe->num_cepstra;
        }
        fe->feature_dimension = (uint8)uVar4;
        dVar12 = cmd_ln_float_r(config,"-upperf");
        mel->upper_filt_freq = (float32)(float)dVar12;
        dVar12 = cmd_ln_float_r(config,"-lowerf");
        mel->lower_filt_freq = (float32)(float)dVar12;
        lVar11 = cmd_ln_int_r(config,"-doublebw");
        mel->doublewide = (uint)(lVar11 != 0);
        pcVar10 = cmd_ln_str_r(config,"-warp_type");
        mel->warp_type = pcVar10;
        pcVar10 = cmd_ln_str_r(config,"-warp_params");
        mel->warp_params = pcVar10;
        lVar11 = cmd_ln_int_r(config,"-lifter");
        mel->lifter_val = (int32)lVar11;
        lVar11 = cmd_ln_int_r(config,"-unit_area");
        mel->unit_area = (uint)(lVar11 != 0);
        lVar11 = cmd_ln_int_r(config,"-round_filters");
        mel->round_filters = (uint)(lVar11 != 0);
        iVar2 = fe_warp_set(mel,mel->warp_type);
        if (iVar2 == 0) {
          fe_warp_set_parameters(mel,mel->warp_params,(float)mel->sampling_rate);
        }
        else {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_interface.c"
                  ,0xa3,"Failed to initialize the warping function.\n");
        }
        if ((float)fe->mel_fb->upper_filt_freq <= (float)fe->sampling_rate * 0.5 + 1.0) {
          fe_build_melfilters(fe->mel_fb);
          fe_compute_melcosine(fe->mel_fb);
          if ((fe->remove_noise != '\0') || (fe->remove_silence != '\0')) {
            pnVar5 = fe_init_noisestats(fe->mel_fb->num_filters);
            fe->noise_stats = pnVar5;
          }
          pvVar6 = (vad_data_t *)
                   __ckd_calloc__(1,0x10,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_interface.c"
                                  ,0x11c);
          fe->vad_data = pvVar6;
          if (fe->log_spec == '\x01') {
            num_cepstra = fe->mel_fb->num_filters;
          }
          else {
            num_cepstra = (uint)fe->num_cepstra;
          }
          ppVar7 = fe_prespch_init(fe->pre_speech + 1,num_cepstra,(int)fe->frame_shift);
          fe->vad_data->prespch_buf = ppVar7;
          piVar3 = (int16 *)__ckd_calloc__((long)fe->frame_size,2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_interface.c"
                                           ,0x122);
          fe->spch = piVar3;
          pfVar8 = (frame_t *)
                   __ckd_calloc__((long)fe->fft_size,8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_interface.c"
                                  ,0x123);
          fe->frame = pfVar8;
          ppVar9 = (powspec_t *)
                   __ckd_calloc__((long)fe->fft_size,8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_interface.c"
                                  ,0x124);
          fe->spec = ppVar9;
          ppVar9 = (powspec_t *)
                   __ckd_calloc__((long)fe->mel_fb->num_filters,8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_interface.c"
                                  ,0x125);
          fe->mfspec = ppVar9;
          pfVar8 = (frame_t *)
                   __ckd_calloc__((long)(fe->fft_size / 4),8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_interface.c"
                                  ,0x128);
          fe->ccc = pfVar8;
          pfVar8 = (frame_t *)
                   __ckd_calloc__((long)(fe->fft_size / 4),8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_interface.c"
                                  ,0x129);
          fe->sss = pfVar8;
          fe_create_twiddle(fe);
          lVar11 = cmd_ln_int_r(config,"-verbose");
          if (lVar11 != 0) {
            fe_print_current(fe);
          }
          fe_start_utt(fe);
          return fe;
        }
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_interface.c"
                ,0x111,"Upper frequency %.1f is higher than samprate/2 (%.1f)\n");
        goto LAB_0010d302;
      }
      pcVar10 = "Number of FFT points has to be a power of 2 higher than %d, it is %d\n";
      lVar11 = 0xfa;
    }
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_interface.c"
            ,lVar11,pcVar10);
  }
LAB_0010d302:
  fe_free(fe);
  return (fe_t *)0x0;
}

Assistant:

fe_t *
fe_init_auto_r(cmd_ln_t *config)
{
    fe_t *fe;
    int prespch_frame_len;

    fe = (fe_t*)ckd_calloc(1, sizeof(*fe));
    fe->refcount = 1;

    /* transfer params to front end */
    if (fe_parse_general_params(cmd_ln_retain(config), fe) < 0) {
        fe_free(fe);
        return NULL;
    }

    /* compute remaining fe parameters */
    /* We add 0.5 so approximate the float with the closest
     * integer. E.g., 2.3 is truncate to 2, whereas 3.7 becomes 4
     */
    fe->frame_shift = (int32) (fe->sampling_rate / fe->frame_rate + 0.5);
    fe->frame_size = (int32) (fe->window_length * fe->sampling_rate + 0.5);
    fe->pre_emphasis_prior = 0;
    
    fe_start_stream(fe);

    assert (fe->frame_shift > 1);

    if (fe->frame_size < fe->frame_shift) {
        E_ERROR
            ("Frame size %d (-wlen) must be greater than frame shift %d (-frate)\n",
             fe->frame_size, fe->frame_shift);
        fe_free(fe);
        return NULL;
    }


    if (fe->frame_size > (fe->fft_size)) {
        E_ERROR
            ("Number of FFT points has to be a power of 2 higher than %d, it is %d\n",
             fe->frame_size, fe->fft_size);
        fe_free(fe);
        return NULL;
    }

    if (fe->dither)
        fe_init_dither(fe->dither_seed);

    /* establish buffers for overflow samps and hamming window */
    fe->overflow_samps = ckd_calloc(fe->frame_size, sizeof(int16));
    fe->hamming_window = ckd_calloc(fe->frame_size/2, sizeof(window_t));

    /* create hamming window */
    fe_create_hamming(fe->hamming_window, fe->frame_size);

    /* init and fill appropriate filter structure */
    fe->mel_fb = ckd_calloc(1, sizeof(*fe->mel_fb));

    /* transfer params to mel fb */
    fe_parse_melfb_params(config, fe, fe->mel_fb);
    
    if (fe->mel_fb->upper_filt_freq > fe->sampling_rate / 2 + 1.0) {
	E_ERROR("Upper frequency %.1f is higher than samprate/2 (%.1f)\n", 
		fe->mel_fb->upper_filt_freq, fe->sampling_rate / 2);
	fe_free(fe);
	return NULL;
    }
    
    fe_build_melfilters(fe->mel_fb);

    fe_compute_melcosine(fe->mel_fb);
    if (fe->remove_noise || fe->remove_silence)
        fe->noise_stats = fe_init_noisestats(fe->mel_fb->num_filters);

    fe->vad_data = (vad_data_t*)ckd_calloc(1, sizeof(*fe->vad_data));
    prespch_frame_len = fe->log_spec != RAW_LOG_SPEC ? fe->num_cepstra : fe->mel_fb->num_filters;
    fe->vad_data->prespch_buf = fe_prespch_init(fe->pre_speech + 1, prespch_frame_len, fe->frame_shift);

    /* Create temporary FFT, spectrum and mel-spectrum buffers. */
    /* FIXME: Gosh there are a lot of these. */
    fe->spch = ckd_calloc(fe->frame_size, sizeof(*fe->spch));
    fe->frame = ckd_calloc(fe->fft_size, sizeof(*fe->frame));
    fe->spec = ckd_calloc(fe->fft_size, sizeof(*fe->spec));
    fe->mfspec = ckd_calloc(fe->mel_fb->num_filters, sizeof(*fe->mfspec));

    /* create twiddle factors */
    fe->ccc = ckd_calloc(fe->fft_size / 4, sizeof(*fe->ccc));
    fe->sss = ckd_calloc(fe->fft_size / 4, sizeof(*fe->sss));
    fe_create_twiddle(fe);

    if (cmd_ln_boolean_r(config, "-verbose")) {
        fe_print_current(fe);
    }

    /*** Initialize the overflow buffers ***/
    fe_start_utt(fe);
    return fe;
}